

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

f32 wabt::interp::Convert<float,double>(f64 val)

{
  if (ABS((double)val) <= 3.4028234663852886e+38) {
    return (f32)(float)(double)val;
  }
  if ((3.4028234663852886e+38 < (double)val) && ((double)val < 3.4028235677973366e+38)) {
    return 3.4028235e+38;
  }
  if ((-3.4028235677973366e+38 < (double)val) && ((double)val < -3.4028234663852886e+38)) {
    return -3.4028235e+38;
  }
  if (!NAN((double)val)) {
    return (f32)((uint)(float)(double)val & 0x80000000 | (uint)DAT_001e3370);
  }
  return NAN;
}

Assistant:

inline f32 WABT_VECTORCALL Convert(f64 val) {
  // The WebAssembly rounding mode means that these values (which are > F32_MAX)
  // should be rounded to F32_MAX and not set to infinity. Unfortunately, UBSAN
  // complains that the value is not representable as a float, so we'll special
  // case them.
  const f64 kMin = 3.4028234663852886e38;
  const f64 kMax = 3.4028235677973366e38;
  if (WABT_LIKELY(val >= -kMin && val <= kMin)) {
    return val;
  } else if (WABT_UNLIKELY(val > kMin && val < kMax)) {
    return std::numeric_limits<f32>::max();
  } else if (WABT_UNLIKELY(val > -kMax && val < -kMin)) {
    return -std::numeric_limits<f32>::max();
  } else if (WABT_UNLIKELY(std::isnan(val))) {
    return std::numeric_limits<f32>::quiet_NaN();
  } else {
    return std::copysign(std::numeric_limits<f32>::infinity(), val);
  }
}